

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bogus.cpp
# Opt level: O3

value128 my_full_multiplication(uint64_t value1,uint64_t value2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = value2;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = value1;
  return (value128)(auVar1 * auVar2);
}

Assistant:

fast_double_parser::value128 my_full_multiplication(uint64_t value1, uint64_t value2) {
    return fast_double_parser::full_multiplication(value1, value2);
}